

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

string * __thiscall ZXing::Error::location_abi_cxx11_(Error *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string file;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  string local_88 [32];
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [48];
  
  if (*(long *)(in_RSI + 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,(allocator<char> *)in_RSI
              );
    std::allocator<char>::~allocator(&local_31);
    __rhs = local_30;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff;
    std::__cxx11::string::find_last_of((char *)__rhs,0x30a844);
    std::__cxx11::string::substr((ulong)local_88,(ulong)__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::to_string(in_stack_ffffffffffffff6c);
    std::operator+(in_stack_ffffffffffffff58,in_RSI);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_30);
  }
  return in_RDI;
}

Assistant:

std::string Error::location() const
{
	if (!_file)
		return {};
	std::string file(_file);
	return file.substr(file.find_last_of("/\\") + 1) + ":" + std::to_string(_line);
}